

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O2

QVariant * __thiscall
HtmlModelSerialiserPrivate::readHtmlVariant
          (QVariant *__return_storage_ptr__,HtmlModelSerialiserPrivate *this,
          QXmlStreamReader *reader,int valType)

{
  char cVar1;
  bool bVar2;
  QString *val;
  QStringView lhs;
  QStringView rhs;
  QArrayDataPointer<char16_t> local_e8;
  QXmlStreamAttributes imgAttributes;
  QArrayDataPointer<char16_t> local_b8;
  HtmlModelSerialiserPrivate *local_98;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QStringView local_40;
  
  if ((valType - 0x1001U < 9) && ((0x121U >> (valType - 0x1001U & 0x1f) & 1) != 0)) {
    cVar1 = QXmlStreamReader::readNextStartElement();
    if (cVar1 != '\0') {
      local_98 = this;
      lhs = (QStringView)QXmlStreamReader::name();
      _imgAttributes = (Data *)0x0;
      local_e8.d = (Data *)0x0;
      local_e8.ptr = (char16_t *)0x0;
      local_e8.size = 0;
      rhs.m_data = L"img";
      rhs.m_size = 3;
      bVar2 = operator!=(lhs,rhs);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&imgAttributes)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      if (!bVar2) {
        QXmlStreamReader::attributes();
        local_e8.d = (Data *)0x0;
        local_e8.ptr = L"src";
        local_e8.size = 3;
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (char16_t *)0x0;
        local_b8.size = 0;
        bVar2 = QXmlStreamAttributes::hasAttribute(&imgAttributes,(QString *)&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        if (bVar2) {
          local_b8.d = (Data *)0x0;
          local_b8.ptr = L"src";
          local_b8.size = 3;
          local_58.d = (Data *)0x0;
          local_58.ptr = (char16_t *)0x0;
          local_58.size = 0;
          local_40 = (QStringView)QXmlStreamAttributes::value((QString *)&imgAttributes);
          QStringView::toString((QString *)&local_e8,&local_40);
          local_90.d = (Data *)0x0;
          local_90.ptr = L"data:image/png;base64,";
          local_90.size = 0x16;
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_78.size = 0;
          val = (QString *)QString::remove((longlong)&local_e8,0);
          AbstractStringSerialiserPrivate::loadVariant
                    (__return_storage_ptr__,&local_98->super_AbstractStringSerialiserPrivate,valType
                     ,val);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        }
        else {
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
        }
        QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                  ((QArrayDataPointer<QXmlStreamAttribute> *)&imgAttributes);
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    QXmlStreamReader::readElementText(&imgAttributes,reader,0);
    AbstractStringSerialiserPrivate::loadVariant
              (__return_storage_ptr__,&this->super_AbstractStringSerialiserPrivate,valType,
               (QString *)&imgAttributes);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&imgAttributes);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant HtmlModelSerialiserPrivate::readHtmlVariant(QXmlStreamReader &reader, int valType) const
{
    if (isImageType(valType)) {
        if (!reader.readNextStartElement())
            return QVariant();
        if (reader.name() != QStringLiteral("img"))
            return QVariant();
        const QXmlStreamAttributes imgAttributes = reader.attributes();
        if (!imgAttributes.hasAttribute(QStringLiteral("src")))
            return QVariant();
        return loadVariant(valType, imgAttributes.value(QStringLiteral("src")).toString().remove(0, QStringLiteral("data:image/png;base64,").size()));
    }
    return loadVariant(valType, reader.readElementText());
}